

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void test_injection(_Mem *mem,double n)

{
  int iVar1;
  Code *rstdin;
  Code *pCVar2;
  uint64_t time;
  Fact *this;
  Code *pCVar3;
  undefined8 uVar4;
  _Mem *mem_00;
  double i;
  DebugStream local_89;
  double local_88;
  undefined8 local_80;
  double local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  char *local_50;
  long local_48;
  char local_40 [16];
  
  mem_00 = mem;
  local_88 = n;
  rstdin = (Code *)r_exec::_Mem::get_stdin();
  local_80 = (*r_exec::Now)();
  i = 0.0;
  if (0.0 < local_88) {
    do {
      pCVar3 = rstdin;
      local_78 = i;
      pCVar2 = make_object(mem_00,rstdin,i);
      time = (*r_exec::Now)();
      this = (Fact *)r_exec::Fact::operator_new((Fact *)0x150,(ulong)pCVar3);
      r_exec::Fact::Fact(this,pCVar2,time,time,1.0,1.0);
      pCVar3 = (Code *)build_view(time,rstdin);
      r_exec::View::set_object(pCVar3);
      mem_00 = mem;
      r_exec::_Mem::inject((View *)mem);
      i = local_78 + 1.0;
    } while (i < local_88);
  }
  (*r_exec::Now)();
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"main","");
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_70 + local_68);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&s_debugSection);
  if (iVar1 != 0) {
    uVar4 = std::__throw_system_error(iVar1);
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    _Unwind_Resume(uVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"for-loop total time: ",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  DebugStream::~DebugStream(&local_89);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void test_injection(r_exec::_Mem *mem, double n)
{
    Code* rstdin = mem->get_stdin();
    // mem->timings_report.clear();
    // uint64_t tt1 = 0;
    // uint64_t tt2 = 0;
    // uint64_t tt3 = 0;
    // uint64_t tt4 = 0;
    // std::vector<uint64> v1, v2, v3, v4;
    // v1.reserve(n);
    // v2.reserve(n);
    // v3.reserve(n);
    // v4.reserve(n);
    uint64_t t0 = r_exec::Now();

    for (double i = 0; i < n; ++i) {
        // tt1 = r_exec::Now();
        Code* object = make_object(mem, rstdin, i);
        uint64_t now = r_exec::Now();
        // v1.push_back(now - tt1);
        // Build a fact.
        // tt2 = now;
        Code *fact = new r_exec::Fact(object, now, now, 1, 1);
        // uint64_t tt = r_exec::Now();
        // v2.push_back(tt - tt2);
        // Build a default view for the fact.
        // tt3 = tt;
        r_exec::View *view = build_view(now, rstdin);
        // tt = r_exec::Now();
        // v3.push_back(tt - tt3);
        // Inject the view.
        // tt4 = tt;
        view->set_object(fact);
        mem->inject(view);
        // v4.push_back(r_exec::Now() - tt4);
    }

    uint64_t t1 = r_exec::Now();
    uint64_t t2 = t1 - t0;
    debug("main") << "for-loop total time: " << t2;
    /* uint64_t acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v1[i];
    std::cout<<v1[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time make_object: "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v2[i];
    // std::cout<<v2[i]<<'/'<<mem->timings_report[i]<<'\t';
    std::cout<<v2[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time new Fact : "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v3[i];
    std::cout<<v3[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time build_view : "<<acc<< std::endl;
    acc=0;
    for(uint64_t i=0;i<n;++i){
    acc+=v4[i];
    std::cout<<v4[i]<<'\t';
    }
    std::cout<<"\nfor-loop accumulated time mem->inject: "<<acc<< std::endl;
    */
}